

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int initudpcli(SOCKET *pSock,char *address,char *port)

{
  int iVar1;
  sockaddr local_38;
  
  iVar1 = socket(2,2,0x11);
  *pSock = iVar1;
  if (iVar1 != -1) {
    iVar1 = setsockettimeouts(iVar1,10000);
    if (iVar1 == 0) {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_family = 2;
      iVar1 = atoi(port);
      local_38.sa_data._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
      local_38.sa_data._2_4_ = inet_addr(address);
      iVar1 = connect(*pSock,&local_38,0x10);
      if (iVar1 == 0) {
        return 0;
      }
    }
    close(*pSock);
  }
  return 1;
}

Assistant:

inline int initudpcli(SOCKET* pSock, char* address, char* port)
{
	struct sockaddr_in sa;

#ifdef _WIN32
	WSADATA wsaData;
#endif // _WIN32

#ifdef _WIN32
	// Initiate use of the Winsock 2 DLL (WS2_32.dll) by a process.
	if (WSAStartup(MAKEWORD(2,2), &wsaData) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"WSAStartup failed. ", 
			address, port));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	// Create a UDP IPv4 socket.
	*pSock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (*pSock == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"socket failed. ", 
			address, port));
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Configure timeouts for send and recv.
	if (setsockettimeouts(*pSock, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"setsockettimeouts failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	memset(&sa, 0, sizeof(sa));

	// The sockaddr_in structure specifies the address family,
	// IP address, and port of the server to be connected to.
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(port));
	sa.sin_addr.s_addr = inet_addr(address);

//	// Associate the client to the desired address and port.
//	if (bind(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
//	{
//		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
//			strtime_m(), 
//			"bind failed. ", 
//			address, port));
//		closesocket(*pSock);
//#ifdef _WIN32
//		WSACleanup();
//#endif // _WIN32
//		return EXIT_FAILURE;
//	}

	// Connect to server.
	if (connect(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("initudpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"connect failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}